

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.c++
# Opt level: O2

ssize_t __thiscall kj::InputStream::read(InputStream *this,int __fd,void *__buf,size_t __nbytes)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  Fault f;
  void *pvVar2;
  
  iVar1 = (*this->_vptr_InputStream[2])();
  pvVar2 = (void *)CONCAT44(extraout_var,iVar1);
  if (pvVar2 <= __buf && (long)__buf - (long)pvVar2 != 0) {
    _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[14]>
              (&f,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/io.c++"
               ,0x35,FAILED,"n >= minBytes","\"Premature EOF\"",(char (*) [14])"Premature EOF");
    memset((void *)(CONCAT44(in_register_00000034,__fd) + (long)pvVar2),0,(long)__buf - (long)pvVar2
          );
    _::Debug::Fault::~Fault(&f);
    pvVar2 = __buf;
  }
  return (ssize_t)pvVar2;
}

Assistant:

size_t InputStream::read(void* buffer, size_t minBytes, size_t maxBytes) {
  size_t n = tryRead(buffer, minBytes, maxBytes);
  KJ_REQUIRE(n >= minBytes, "Premature EOF") {
    // Pretend we read zeros from the input.
    memset(reinterpret_cast<byte*>(buffer) + n, 0, minBytes - n);
    return minBytes;
  }
  return n;
}